

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O1

int zt_ipv4_str2net(char *str,uint32_t *outaddr,int *outbitlen)

{
  undefined8 uVar1;
  int iVar2;
  in_addr_t iVar3;
  char *__s;
  char *__cp;
  char *pcVar4;
  int iVar5;
  
  if (outbitlen == (int *)0x0 || (outaddr == (uint32_t *)0x0 || str == (char *)0x0)) {
    return -1;
  }
  __s = strdup(str);
  if (__s == (char *)0x0) {
    return -1;
  }
  __cp = (char *)calloc(0x10,1);
  if (__cp == (char *)0x0) {
    iVar2 = -1;
    goto LAB_00123479;
  }
  pcVar4 = strchr(__s,0x2f);
  if (pcVar4 == (char *)0x0) {
    uVar1 = *(undefined8 *)(str + 8);
    *(undefined8 *)__cp = *(undefined8 *)str;
    *(undefined8 *)(__cp + 8) = uVar1;
    iVar2 = 0x20;
LAB_00123452:
    iVar5 = 0x20;
    if (iVar2 < 0x20) {
      iVar5 = iVar2;
    }
    iVar3 = inet_addr(__cp);
    *outaddr = iVar3 >> 0x18 | (iVar3 & 0xff0000) >> 8 | (iVar3 & 0xff00) << 8 | iVar3 << 0x18;
    *outbitlen = iVar5;
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
    if ((long)pcVar4 - (long)__s < 0x10) {
      iVar2 = atoi(pcVar4 + 1);
      memcpy(__cp,str,(long)pcVar4 - (long)__s);
      goto LAB_00123452;
    }
  }
  free(__cp);
LAB_00123479:
  free(__s);
  return iVar2;
}

Assistant:

int
zt_ipv4_str2net(const char *str, uint32_t * outaddr, int *outbitlen)
{
    char *save;
    char *str_cp;
    char *cp;
    int   bitlen = 32;

    if (!str || !outaddr || !outbitlen) {
        return -1;
    }

    if (!(str_cp = strdup(str))) {
        return -1;
    }

    if (!(save = calloc(MAXLINE, 1))) {
        free(str_cp);
        return -1;
    }

    if ((cp = strchr(str_cp, '/')) != NULL) {
        bitlen = atoi(cp + 1);

        if ((cp - str_cp) > MAXLINE - 1) {
            free(save);
            free(str_cp);
            return -1;
        }

        memcpy(save, str, cp - str_cp);
    } else {
        bitlen = 32;
        memcpy(save, str, MAXLINE);
    }

    if (bitlen > 32) {
        bitlen = 32;
    }

    *outaddr = ntohl(inet_addr(save));
    *outbitlen = bitlen;

    free(save);
    free(str_cp);

    return 0;
}